

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTreeIndex::prepareBoundingRectChange
          (QGraphicsSceneBspTreeIndex *this,QGraphicsItem *item)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  long i_00;
  qsizetype qVar3;
  const_reference ppQVar4;
  long in_RSI;
  QList<QGraphicsItem_*> *in_RDI;
  QGraphicsSceneBspTreeIndexPrivate *unaff_retaddr;
  int i;
  QGraphicsItem *thatItem;
  QGraphicsSceneBspTreeIndexPrivate *d;
  int local_24;
  QList<QGraphicsItem_*> *pQVar5;
  undefined2 uVar6;
  
  if (in_RSI != 0) {
    pQVar5 = in_RDI;
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RSI + 8));
    uVar6 = (undefined2)((ulong)pQVar5 >> 0x30);
    if (pQVar2->index != -1) {
      pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RSI + 8));
      bVar1 = QGraphicsItemPrivate::itemIsUntransformable(pQVar2);
      if (((!bVar1) &&
          (pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                  *)(in_RSI + 8)), (*(ulong *)&pQVar2->field_0x160 & 0x20000) == 0))
         && (pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                      ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                    *)(in_RSI + 8)),
            (*(ulong *)&pQVar2->field_0x160 & 0x100000) == 0)) {
        d_func((QGraphicsSceneBspTreeIndex *)0xa1f4c3);
        QGraphicsSceneBspTreeIndexPrivate::removeItem
                  (unaff_retaddr,item,SUB21((ushort)uVar6 >> 8,0),SUB21(uVar6,0));
        local_24 = 0;
        while( true ) {
          i_00 = (long)local_24;
          pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)(in_RSI + 8));
          qVar3 = QList<QGraphicsItem_*>::size(&pQVar2->children);
          if (qVar3 <= i_00) break;
          QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
          operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                      *)(in_RSI + 8));
          ppQVar4 = QList<QGraphicsItem_*>::at(in_RDI,i_00);
          (**(code **)&(in_RDI->d).d[0xd].super_QArrayData)(in_RDI,*ppQVar4);
          local_24 = local_24 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndex::prepareBoundingRectChange(const QGraphicsItem *item)
{
    if (!item)
        return;

    if (item->d_ptr->index == -1 || item->d_ptr->itemIsUntransformable()
        || (item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
            || item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren)) {
        return; // Item is not in BSP tree; nothing to do.
    }

    Q_D(QGraphicsSceneBspTreeIndex);
    QGraphicsItem *thatItem = const_cast<QGraphicsItem *>(item);
    d->removeItem(thatItem, /*recursive=*/false, /*moveToUnindexedItems=*/true);
    for (int i = 0; i < item->d_ptr->children.size(); ++i)  // ### Do we really need this?
        prepareBoundingRectChange(item->d_ptr->children.at(i));
}